

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_ssse3.c
# Opt level: O2

void aom_scaled_2d_ssse3(uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
                        InterpKernel *filter,int x0_q4,int x_step_q4,int y0_q4,int y_step_q4,int w,
                        int h)

{
  uint8_t *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [14];
  undefined1 auVar8 [12];
  unkbyte10 Var9;
  undefined1 auVar10 [14];
  undefined1 auVar11 [12];
  unkbyte10 Var12;
  undefined1 auVar13 [14];
  undefined1 auVar14 [12];
  unkbyte10 Var15;
  undefined1 auVar16 [14];
  undefined1 auVar17 [12];
  unkbyte10 Var18;
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  ulong __n;
  long lVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  uint8_t *puVar31;
  int x_q4;
  uint uVar32;
  uint8_t *puVar33;
  bool bVar34;
  short extraout_XMM0_Wa;
  short extraout_XMM0_Wa_00;
  undefined4 uVar35;
  undefined4 extraout_XMM0_Da;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  short extraout_XMM0_Wb;
  short extraout_XMM0_Wc;
  short extraout_XMM0_Wd;
  short extraout_XMM0_We;
  short extraout_XMM0_Wf;
  short extraout_XMM0_Wg;
  short extraout_XMM0_Wh;
  undefined1 auVar37 [16];
  short extraout_XMM0_Wb_00;
  short extraout_XMM0_Wc_00;
  short extraout_XMM0_Wd_00;
  short extraout_XMM0_We_00;
  undefined8 extraout_XMM0_Qb;
  short extraout_XMM0_Wf_00;
  short extraout_XMM0_Wg_00;
  short extraout_XMM0_Wh_00;
  undefined1 auVar46 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  undefined4 uVar63;
  undefined8 uVar64;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar85 [16];
  uint local_257c;
  uint8_t *local_2578;
  uint8_t *local_2570;
  uint8_t *local_2558;
  undefined8 local_2528;
  short sStack_2520;
  short sStack_251e;
  short sStack_251c;
  short sStack_251a;
  __m128i s [8];
  uint8_t temp_1 [16];
  undefined8 local_2438;
  uint8_t uStack_2430;
  uint8_t uStack_242f;
  uint8_t uStack_242e;
  uint8_t uStack_242d;
  uint8_t uStack_242c;
  uint8_t uStack_242b;
  uint8_t uStack_242a;
  uint8_t uStack_2429;
  uint8_t local_2428;
  uint8_t uStack_2427;
  uint8_t uStack_2426;
  uint8_t uStack_2425;
  uint8_t uStack_2424;
  uint8_t uStack_2423;
  uint8_t uStack_2422;
  uint8_t uStack_2421;
  uint8_t uStack_2420;
  uint8_t uStack_241f;
  uint8_t uStack_241e;
  uint8_t uStack_241d;
  uint8_t uStack_241c;
  uint8_t uStack_241b;
  uint8_t uStack_241a;
  uint8_t uStack_2419;
  uint8_t local_2418;
  uint8_t uStack_2417;
  uint8_t uStack_2416;
  uint8_t uStack_2415;
  uint8_t uStack_2414;
  uint8_t uStack_2413;
  uint8_t uStack_2412;
  uint8_t uStack_2411;
  uint8_t uStack_2410;
  uint8_t uStack_240f;
  uint8_t uStack_240e;
  uint8_t uStack_240d;
  uint8_t uStack_240c;
  uint8_t uStack_240b;
  uint8_t uStack_240a;
  uint8_t uStack_2409;
  uint8_t local_2408;
  uint8_t uStack_2407;
  uint8_t uStack_2406;
  uint8_t uStack_2405;
  uint8_t uStack_2404;
  uint8_t uStack_2403;
  uint8_t uStack_2402;
  uint8_t uStack_2401;
  uint8_t uStack_2400;
  uint8_t uStack_23ff;
  uint8_t uStack_23fe;
  uint8_t uStack_23fd;
  uint8_t uStack_23fc;
  uint8_t uStack_23fb;
  uint8_t uStack_23fa;
  uint8_t uStack_23f9;
  uint8_t temp [9152];
  undefined1 auVar38 [16];
  undefined1 auVar36 [12];
  undefined1 auVar47 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar48 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar45 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar58 [16];
  undefined1 auVar61 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar68 [16];
  undefined1 auVar65 [12];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  
  local_257c = y0_q4;
  uVar26 = ((h + -1) * y_step_q4 + y0_q4 >> 4) + 8;
  local_2570 = src + src_stride * -3;
  local_2528 = src + src_stride * -3 + -3;
  __n = (ulong)(uint)w;
  if (w < 8) {
    local_2558 = temp;
    for (iVar27 = 0; iVar27 < (int)uVar26; iVar27 = iVar27 + 4) {
      uVar32 = x0_q4;
      for (lVar30 = 0; lVar30 < w; lVar30 = lVar30 + 4) {
        puVar33 = temp_1;
        for (lVar23 = 0; lVar23 != 4; lVar23 = lVar23 + 1) {
          if ((uVar32 & 0xf) == 0) {
            puVar31 = local_2570 + ((int)uVar32 >> 4);
            for (lVar25 = 0; lVar25 != 4; lVar25 = lVar25 + 1) {
              puVar33[lVar25] = *puVar31;
              puVar31 = puVar31 + src_stride;
            }
          }
          else {
            load_8bit_8x4(local_2528 + ((int)uVar32 >> 4),src_stride,s);
            auVar49._0_12_ = s[0]._0_12_;
            auVar49._12_2_ = s[0][0]._6_2_;
            auVar49._14_2_ = s[1][0]._6_2_;
            auVar48._12_4_ = auVar49._12_4_;
            auVar48._0_10_ = s[0]._0_10_;
            auVar48._10_2_ = s[1][0]._4_2_;
            auVar47._10_6_ = auVar48._10_6_;
            auVar47._0_8_ = s[0][0];
            auVar47._8_2_ = s[0][0]._4_2_;
            auVar21._4_8_ = auVar47._8_8_;
            auVar21._2_2_ = s[1][0]._2_2_;
            auVar21._0_2_ = s[0][0]._2_2_;
            auVar46._0_4_ = CONCAT22((undefined2)s[1][0],(short)s[0][0]);
            auVar46._4_12_ = auVar21;
            auVar62._0_12_ = s[2]._0_12_;
            auVar62._12_2_ = s[2][0]._6_2_;
            auVar62._14_2_ = s[3][0]._6_2_;
            auVar61._12_4_ = auVar62._12_4_;
            auVar61._0_10_ = s[2]._0_10_;
            auVar61._10_2_ = s[3][0]._4_2_;
            auVar60._10_6_ = auVar61._10_6_;
            auVar60._0_8_ = s[2][0];
            auVar60._8_2_ = s[2][0]._4_2_;
            auVar22._4_8_ = auVar60._8_8_;
            auVar22._2_2_ = s[3][0]._2_2_;
            auVar22._0_2_ = s[2][0]._2_2_;
            s[0][0]._6_2_ = (undefined2)s[3][0];
            s[0][0]._4_2_ = (short)s[2][0];
            auVar76._0_8_ = auVar46._0_8_;
            auVar76._8_4_ = auVar21._0_4_;
            auVar76._12_4_ = auVar22._0_4_;
            s[0][0]._0_4_ = auVar46._0_4_;
            s[0][1] = auVar76._8_8_;
            s[1][1] = 0;
            s[1][0] = auVar76._8_8_;
            s[2][0]._4_4_ = auVar60._8_4_;
            s[2][0]._0_4_ = auVar47._8_4_;
            s[2][1]._0_4_ = auVar48._12_4_;
            s[2][1]._4_4_ = auVar61._12_4_;
            s[3][0]._4_4_ = auVar61._12_4_;
            s[3][0]._0_4_ = auVar48._12_4_;
            s[3][1] = 0;
            shuffle_filter_convolve8_8_ssse3
                      (s,(int16_t *)((long)*filter + (ulong)((uVar32 & 0xf) << 4)));
            sVar2 = (short)extraout_XMM0_Qa_00;
            sVar3 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
            sVar4 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
            sVar5 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
            *(uint *)(temp_1 + lVar23 * 4) =
                 CONCAT13((0 < sVar5) * (sVar5 < 0x100) * (char)((ulong)extraout_XMM0_Qa_00 >> 0x30)
                          - (0xff < sVar5),
                          CONCAT12((0 < sVar4) * (sVar4 < 0x100) *
                                   (char)((ulong)extraout_XMM0_Qa_00 >> 0x20) - (0xff < sVar4),
                                   CONCAT11((0 < sVar3) * (sVar3 < 0x100) *
                                            (char)((ulong)extraout_XMM0_Qa_00 >> 0x10) -
                                            (0xff < sVar3),
                                            (0 < sVar2) * (sVar2 < 0x100) *
                                            (char)extraout_XMM0_Qa_00 - (0xff < sVar2))));
          }
          uVar32 = uVar32 + x_step_q4;
          puVar33 = puVar33 + 4;
        }
        auVar6[1] = temp_1[1];
        auVar6[0] = temp_1[0];
        auVar6[2] = temp_1[2];
        auVar6[3] = temp_1[3];
        auVar6[4] = temp_1[4];
        auVar6[5] = temp_1[5];
        auVar6[6] = temp_1[6];
        auVar6[7] = temp_1[7];
        auVar6[8] = temp_1[8];
        auVar6[9] = temp_1[9];
        auVar6[10] = temp_1[10];
        auVar6[0xb] = temp_1[0xb];
        auVar6[0xc] = temp_1[0xc];
        auVar6[0xd] = temp_1[0xd];
        auVar6[0xe] = temp_1[0xe];
        auVar6[0xf] = temp_1[0xf];
        auVar49 = pshufb(auVar6,_DAT_004687a0);
        *(int *)(local_2558 + lVar30) = auVar49._0_4_;
        *(int *)(local_2558 + lVar30 + 0x40) = auVar49._4_4_;
        *(int *)(local_2558 + lVar30 + 0x80) = auVar49._8_4_;
        *(int *)(local_2558 + lVar30 + 0xc0) = auVar49._12_4_;
      }
      local_2528 = local_2528 + src_stride * 4;
      local_2558 = local_2558 + 0x100;
      local_2570 = local_2570 + src_stride * 4;
    }
  }
  else {
    iVar27 = (uVar26 & 0xfffffff8) + 8;
    local_2558 = temp;
    do {
      uVar26 = x0_q4;
      for (uVar28 = 0; uVar28 < __n; uVar28 = uVar28 + 8) {
        puVar33 = (uint8_t *)&local_2438;
        for (lVar30 = 0; lVar30 != 8; lVar30 = lVar30 + 1) {
          if ((uVar26 & 0xf) == 0) {
            puVar31 = local_2570 + ((int)uVar26 >> 4);
            for (lVar23 = 0; lVar23 != 8; lVar23 = lVar23 + 1) {
              puVar33[lVar23] = *puVar31;
              puVar31 = puVar31 + src_stride;
            }
          }
          else {
            load_8bit_8x8(local_2528 + ((int)uVar26 >> 4),src_stride,s);
            auVar66._0_12_ = s[4]._0_12_;
            auVar66._12_2_ = s[4][0]._6_2_;
            auVar66._14_2_ = s[5][0]._6_2_;
            local_2438._0_4_ = auVar66._12_4_;
            auVar77._0_12_ = s[6]._0_12_;
            auVar77._12_2_ = s[6][0]._6_2_;
            auVar77._14_2_ = s[7][0]._6_2_;
            local_2438._4_4_ = auVar77._12_4_;
            temp_1[0] = (uint8_t)s[0][0];
            temp_1[1] = s[0][0]._1_1_;
            temp_1[2] = (uint8_t)s[1][0];
            temp_1[3] = s[1][0]._1_1_;
            temp_1[4] = (uint8_t)s[2][0];
            temp_1[5] = s[2][0]._1_1_;
            temp_1[6] = (uint8_t)s[3][0];
            temp_1[7] = s[3][0]._1_1_;
            temp_1[8] = (uint8_t)s[4][0];
            temp_1[9] = s[4][0]._1_1_;
            temp_1[10] = (uint8_t)s[5][0];
            temp_1[0xb] = s[5][0]._1_1_;
            temp_1[0xc] = (uint8_t)s[6][0];
            temp_1[0xd] = s[6][0]._1_1_;
            temp_1[0xe] = (uint8_t)s[7][0];
            temp_1[0xf] = s[7][0]._1_1_;
            shuffle_filter_convolve8_8_ssse3
                      ((__m128i *)temp_1,(int16_t *)((long)*filter + (ulong)((uVar26 & 0xf) << 4)));
            (&local_2438)[lVar30] =
                 CONCAT17((0 < extraout_XMM0_Wh) * (extraout_XMM0_Wh < 0x100) *
                          (char)extraout_XMM0_Wh - (0xff < extraout_XMM0_Wh),
                          CONCAT16((0 < extraout_XMM0_Wg) * (extraout_XMM0_Wg < 0x100) *
                                   (char)extraout_XMM0_Wg - (0xff < extraout_XMM0_Wg),
                                   CONCAT15((0 < extraout_XMM0_Wf) * (extraout_XMM0_Wf < 0x100) *
                                            (char)extraout_XMM0_Wf - (0xff < extraout_XMM0_Wf),
                                            CONCAT14((0 < extraout_XMM0_We) *
                                                     (extraout_XMM0_We < 0x100) *
                                                     (char)extraout_XMM0_We -
                                                     (0xff < extraout_XMM0_We),
                                                     CONCAT13((0 < extraout_XMM0_Wd) *
                                                              (extraout_XMM0_Wd < 0x100) *
                                                              (char)extraout_XMM0_Wd -
                                                              (0xff < extraout_XMM0_Wd),
                                                              CONCAT12((0 < extraout_XMM0_Wc) *
                                                                       (extraout_XMM0_Wc < 0x100) *
                                                                       (char)extraout_XMM0_Wc -
                                                                       (0xff < extraout_XMM0_Wc),
                                                                       CONCAT11((0 < 
                                                  extraout_XMM0_Wb) * (extraout_XMM0_Wb < 0x100) *
                                                  (char)extraout_XMM0_Wb - (0xff < extraout_XMM0_Wb)
                                                  ,(0 < extraout_XMM0_Wa) *
                                                   (extraout_XMM0_Wa < 0x100) *
                                                   (char)extraout_XMM0_Wa -
                                                   (0xff < extraout_XMM0_Wa))))))));
          }
          uVar26 = uVar26 + x_step_q4;
          puVar33 = puVar33 + 8;
        }
        load_8bit_8x8((uint8_t *)&local_2438,8,s);
        auVar44._0_14_ = s[0]._0_14_;
        auVar44[0xe] = s[0][0]._7_1_;
        auVar44[0xf] = s[1][0]._7_1_;
        auVar43._14_2_ = auVar44._14_2_;
        auVar43._0_13_ = s[0]._0_13_;
        auVar43[0xd] = s[1][0]._6_1_;
        auVar42._13_3_ = auVar43._13_3_;
        auVar42._0_12_ = s[0]._0_12_;
        auVar42[0xc] = s[0][0]._6_1_;
        auVar41._12_4_ = auVar42._12_4_;
        auVar41._0_11_ = s[0]._0_11_;
        auVar41[0xb] = s[1][0]._5_1_;
        auVar40._11_5_ = auVar41._11_5_;
        auVar40._0_10_ = s[0]._0_10_;
        auVar40[10] = s[0][0]._5_1_;
        auVar39._10_6_ = auVar40._10_6_;
        auVar39._0_9_ = s[0]._0_9_;
        auVar39[9] = s[1][0]._4_1_;
        auVar38._9_7_ = auVar39._9_7_;
        auVar38._0_8_ = s[0][0];
        auVar38[8] = s[0][0]._4_1_;
        Var9 = CONCAT91(CONCAT81(auVar38._8_8_,s[1][0]._3_1_),s[0][0]._3_1_);
        auVar8._2_10_ = Var9;
        auVar8[1] = s[1][0]._2_1_;
        auVar8[0] = s[0][0]._2_1_;
        auVar7._2_12_ = auVar8;
        auVar7[1] = s[1][0]._1_1_;
        auVar7[0] = s[0][0]._1_1_;
        auVar37._0_2_ = CONCAT11((undefined1)s[1][0],(char)s[0][0]);
        auVar37._2_14_ = auVar7;
        auVar56._0_14_ = s[2]._0_14_;
        auVar56[0xe] = s[2][0]._7_1_;
        auVar56[0xf] = s[3][0]._7_1_;
        auVar55._14_2_ = auVar56._14_2_;
        auVar55._0_13_ = s[2]._0_13_;
        auVar55[0xd] = s[3][0]._6_1_;
        auVar54._13_3_ = auVar55._13_3_;
        auVar54._0_12_ = s[2]._0_12_;
        auVar54[0xc] = s[2][0]._6_1_;
        auVar53._12_4_ = auVar54._12_4_;
        auVar53._0_11_ = s[2]._0_11_;
        auVar53[0xb] = s[3][0]._5_1_;
        auVar52._11_5_ = auVar53._11_5_;
        auVar52._0_10_ = s[2]._0_10_;
        auVar52[10] = s[2][0]._5_1_;
        auVar51._10_6_ = auVar52._10_6_;
        auVar51._0_9_ = s[2]._0_9_;
        auVar51[9] = s[3][0]._4_1_;
        auVar50._9_7_ = auVar51._9_7_;
        auVar50._0_8_ = s[2][0];
        auVar50[8] = s[2][0]._4_1_;
        Var12 = CONCAT91(CONCAT81(auVar50._8_8_,s[3][0]._3_1_),s[2][0]._3_1_);
        auVar11._2_10_ = Var12;
        auVar11[1] = s[3][0]._2_1_;
        auVar11[0] = s[2][0]._2_1_;
        auVar10._2_12_ = auVar11;
        auVar10[1] = s[3][0]._1_1_;
        auVar10[0] = s[2][0]._1_1_;
        auVar74._0_14_ = s[4]._0_14_;
        auVar74[0xe] = s[4][0]._7_1_;
        auVar74[0xf] = s[5][0]._7_1_;
        auVar73._14_2_ = auVar74._14_2_;
        auVar73._0_13_ = s[4]._0_13_;
        auVar73[0xd] = s[5][0]._6_1_;
        auVar72._13_3_ = auVar73._13_3_;
        auVar72._0_12_ = s[4]._0_12_;
        auVar72[0xc] = s[4][0]._6_1_;
        auVar71._12_4_ = auVar72._12_4_;
        auVar71._0_11_ = s[4]._0_11_;
        auVar71[0xb] = s[5][0]._5_1_;
        auVar70._11_5_ = auVar71._11_5_;
        auVar70._0_10_ = s[4]._0_10_;
        auVar70[10] = s[4][0]._5_1_;
        auVar69._10_6_ = auVar70._10_6_;
        auVar69._0_9_ = s[4]._0_9_;
        auVar69[9] = s[5][0]._4_1_;
        auVar68._9_7_ = auVar69._9_7_;
        auVar68._0_8_ = s[4][0];
        auVar68[8] = s[4][0]._4_1_;
        Var15 = CONCAT91(CONCAT81(auVar68._8_8_,s[5][0]._3_1_),s[4][0]._3_1_);
        auVar14._2_10_ = Var15;
        auVar14[1] = s[5][0]._2_1_;
        auVar14[0] = s[4][0]._2_1_;
        auVar13._2_12_ = auVar14;
        auVar13[1] = s[5][0]._1_1_;
        auVar13[0] = s[4][0]._1_1_;
        auVar67._0_2_ = CONCAT11((undefined1)s[5][0],(char)s[4][0]);
        auVar67._2_14_ = auVar13;
        auVar84._0_14_ = s[6]._0_14_;
        auVar84[0xe] = s[6][0]._7_1_;
        auVar84[0xf] = s[7][0]._7_1_;
        auVar83._14_2_ = auVar84._14_2_;
        auVar83._0_13_ = s[6]._0_13_;
        auVar83[0xd] = s[7][0]._6_1_;
        auVar82._13_3_ = auVar83._13_3_;
        auVar82._0_12_ = s[6]._0_12_;
        auVar82[0xc] = s[6][0]._6_1_;
        auVar81._12_4_ = auVar82._12_4_;
        auVar81._0_11_ = s[6]._0_11_;
        auVar81[0xb] = s[7][0]._5_1_;
        auVar80._11_5_ = auVar81._11_5_;
        auVar80._0_10_ = s[6]._0_10_;
        auVar80[10] = s[6][0]._5_1_;
        auVar79._10_6_ = auVar80._10_6_;
        auVar79._0_9_ = s[6]._0_9_;
        auVar79[9] = s[7][0]._4_1_;
        auVar78._9_7_ = auVar79._9_7_;
        auVar78._0_8_ = s[6][0];
        auVar78[8] = s[6][0]._4_1_;
        Var18 = CONCAT91(CONCAT81(auVar78._8_8_,s[7][0]._3_1_),s[6][0]._3_1_);
        auVar17._2_10_ = Var18;
        auVar17[1] = s[7][0]._2_1_;
        auVar17[0] = s[6][0]._2_1_;
        auVar16._2_12_ = auVar17;
        auVar16[1] = s[7][0]._1_1_;
        auVar16[0] = s[6][0]._1_1_;
        auVar87._0_12_ = auVar37._0_12_;
        auVar87._12_2_ = (short)Var9;
        auVar87._14_2_ = (short)Var12;
        auVar86._12_4_ = auVar87._12_4_;
        auVar86._0_10_ = auVar37._0_10_;
        auVar86._10_2_ = auVar11._0_2_;
        auVar85._10_6_ = auVar86._10_6_;
        auVar85._0_8_ = auVar37._0_8_;
        auVar85._8_2_ = auVar8._0_2_;
        auVar19._4_8_ = auVar85._8_8_;
        auVar19._2_2_ = auVar10._0_2_;
        auVar19._0_2_ = auVar7._0_2_;
        uVar35 = CONCAT22(auVar50._8_2_,auVar38._8_2_);
        auVar36._0_8_ = CONCAT26(auVar52._10_2_,CONCAT24(auVar40._10_2_,uVar35));
        auVar36._8_2_ = auVar42._12_2_;
        auVar36._10_2_ = auVar54._12_2_;
        auVar45._12_2_ = auVar43._14_2_;
        auVar45._0_12_ = auVar36;
        auVar45._14_2_ = auVar55._14_2_;
        auVar59._0_12_ = auVar67._0_12_;
        auVar59._12_2_ = (short)Var15;
        auVar59._14_2_ = (short)Var18;
        auVar58._12_4_ = auVar59._12_4_;
        auVar58._0_10_ = auVar67._0_10_;
        auVar58._10_2_ = auVar17._0_2_;
        auVar57._10_6_ = auVar58._10_6_;
        auVar57._0_8_ = auVar67._0_8_;
        auVar57._8_2_ = auVar14._0_2_;
        auVar20._4_8_ = auVar57._8_8_;
        auVar20._2_2_ = auVar16._0_2_;
        auVar20._0_2_ = auVar13._0_2_;
        uVar63 = CONCAT22(auVar78._8_2_,auVar68._8_2_);
        auVar65._0_8_ = CONCAT26(auVar80._10_2_,CONCAT24(auVar70._10_2_,uVar63));
        auVar65._8_2_ = auVar72._12_2_;
        auVar65._10_2_ = auVar82._12_2_;
        auVar75._12_2_ = auVar73._14_2_;
        auVar75._0_12_ = auVar65;
        auVar75._14_2_ = auVar83._14_2_;
        *(ulong *)(local_2558 + uVar28) =
             CONCAT44(CONCAT22(CONCAT11((undefined1)s[7][0],(char)s[6][0]),auVar67._0_2_),
                      CONCAT22(CONCAT11((undefined1)s[3][0],(char)s[2][0]),auVar37._0_2_));
        *(ulong *)(local_2558 + uVar28 + 0x40) = CONCAT44(auVar20._0_4_,auVar19._0_4_);
        *(ulong *)(local_2558 + uVar28 + 0x80) = CONCAT44(auVar57._8_4_,auVar85._8_4_);
        uVar64 = CONCAT44(auVar58._12_4_,auVar86._12_4_);
        *(undefined8 *)(local_2558 + uVar28 + 0xc0) = uVar64;
        *(ulong *)(local_2558 + uVar28 + 0x100) = CONCAT44(uVar63,uVar35);
        *(ulong *)(local_2558 + uVar28 + 0x140) =
             CONCAT44((int)((ulong)auVar65._0_8_ >> 0x20),(int)((ulong)auVar36._0_8_ >> 0x20));
        *(ulong *)(local_2558 + uVar28 + 0x180) = CONCAT44(auVar65._8_4_,auVar36._8_4_);
        *(int *)(local_2558 + uVar28 + 0x1c0) = auVar45._12_4_;
        *(int *)(local_2558 + uVar28 + 0x1c0 + 4) = auVar75._12_4_;
      }
      local_2528 = local_2528 + src_stride * 8;
      local_2558 = local_2558 + 0x200;
      local_2570 = local_2570 + src_stride * 8;
      iVar27 = iVar27 + -8;
    } while (iVar27 != 0);
  }
  uVar28 = 0;
  if (w < 0x10) {
    local_2578 = dst;
    if (w == 8) {
      if (0 < h) {
        uVar28 = (ulong)(uint)h;
      }
      while (bVar34 = uVar28 != 0, uVar28 = uVar28 - 1, bVar34) {
        lVar30 = (long)((int)local_257c >> 4) * 0x40;
        if ((local_257c & 0xf) == 0) {
          *(undefined8 *)local_2578 = *(undefined8 *)(temp + lVar30 + 0xc0);
        }
        else {
          load_8bit_8x8(temp + lVar30,0x40,s);
          filter_vert_kernel(s,(int16_t *)((long)*filter + (ulong)((local_257c & 0xf) << 4)));
          *(undefined8 *)local_2578 = extraout_XMM0_Qa_01;
        }
        local_257c = local_257c + y_step_q4;
        local_2578 = local_2578 + dst_stride;
      }
    }
    else {
      if (0 < h) {
        uVar28 = (ulong)(uint)h;
      }
      while (bVar34 = uVar28 != 0, uVar28 = uVar28 - 1, bVar34) {
        lVar30 = (long)((int)local_257c >> 4) * 0x40;
        if ((local_257c & 0xf) == 0) {
          memcpy(local_2578,temp + lVar30 + 0xc0,(long)w);
        }
        else {
          s[0] = (__m128i)ZEXT416(*(uint *)(temp + lVar30));
          s[1] = (__m128i)ZEXT416(*(uint *)(temp + lVar30 + 0x40));
          s[2] = (__m128i)ZEXT416(*(uint *)(temp + lVar30 + 0x80));
          s[3] = (__m128i)ZEXT416(*(uint *)(temp + lVar30 + 0xc0));
          s[4] = (__m128i)ZEXT416(*(uint *)(temp + lVar30 + 0x100));
          s[5] = (__m128i)ZEXT416(*(uint *)(temp + lVar30 + 0x140));
          s[6] = (__m128i)ZEXT416(*(uint *)(temp + lVar30 + 0x180));
          s[7] = (__m128i)ZEXT416(*(uint *)(temp + lVar30 + 0x1c0));
          filter_vert_kernel(s,(int16_t *)((long)*filter + (ulong)((local_257c & 0xf) << 4)));
          *(undefined4 *)local_2578 = extraout_XMM0_Da;
        }
        local_257c = local_257c + y_step_q4;
        local_2578 = local_2578 + dst_stride;
      }
    }
  }
  else {
    uVar24 = (ulong)(uint)h;
    if (h < 1) {
      uVar24 = uVar28;
    }
    puVar33 = dst;
    for (; uVar28 != uVar24; uVar28 = uVar28 + 1) {
      lVar30 = (long)((int)local_257c >> 4) * 0x40;
      if ((local_257c & 0xf) == 0) {
        memcpy(dst + uVar28 * dst_stride,temp + lVar30 + 0xc0,__n);
      }
      else {
        auVar49 = *(undefined1 (*) [16])((long)*filter + (ulong)((local_257c & 0xf) << 4));
        s[0] = (__m128i)pshufb(auVar49,_DAT_004687b0);
        s[1] = (__m128i)pshufb(auVar49,_DAT_004687c0);
        s[2] = (__m128i)pshufb(auVar49,_DAT_004687d0);
        s[3] = (__m128i)pshufb(auVar49,_DAT_004687e0);
        for (uVar29 = 0; uVar29 < __n; uVar29 = uVar29 + 0x10) {
          puVar1 = temp + uVar29 + lVar30;
          temp_1[0] = *puVar1;
          temp_1[2] = puVar1[1];
          temp_1[4] = puVar1[2];
          temp_1[6] = puVar1[3];
          temp_1[8] = puVar1[4];
          temp_1[10] = puVar1[5];
          temp_1[0xc] = puVar1[6];
          temp_1[0xe] = puVar1[7];
          uStack_2430 = puVar1[0xc];
          uStack_242e = puVar1[0xd];
          uStack_242c = puVar1[0xe];
          uStack_242a = puVar1[0xf];
          puVar31 = temp + uVar29 + lVar30 + 0x40;
          temp_1[1] = *puVar31;
          temp_1[3] = puVar31[1];
          temp_1[5] = puVar31[2];
          temp_1[7] = puVar31[3];
          temp_1[9] = puVar31[4];
          temp_1[0xb] = puVar31[5];
          temp_1[0xd] = puVar31[6];
          temp_1[0xf] = puVar31[7];
          uStack_242f = puVar31[0xc];
          uStack_242d = puVar31[0xd];
          uStack_242b = puVar31[0xe];
          uStack_2429 = puVar31[0xf];
          lVar23 = uVar29 + lVar30;
          local_2428 = temp[lVar23 + 0x88];
          uStack_2426 = temp[lVar23 + 0x89];
          uStack_2424 = temp[lVar23 + 0x8a];
          uStack_2422 = temp[lVar23 + 0x8b];
          uStack_2420 = temp[lVar23 + 0x8c];
          uStack_241e = temp[lVar23 + 0x8d];
          uStack_241c = temp[lVar23 + 0x8e];
          uStack_241a = temp[lVar23 + 0x8f];
          lVar23 = uVar29 + lVar30;
          uStack_2427 = temp[lVar23 + 200];
          uStack_2425 = temp[lVar23 + 0xc9];
          uStack_2423 = temp[lVar23 + 0xca];
          uStack_2421 = temp[lVar23 + 0xcb];
          uStack_241f = temp[lVar23 + 0xcc];
          uStack_241d = temp[lVar23 + 0xcd];
          uStack_241b = temp[lVar23 + 0xce];
          uStack_2419 = temp[lVar23 + 0xcf];
          lVar23 = uVar29 + lVar30;
          local_2418 = temp[lVar23 + 0x108];
          uStack_2416 = temp[lVar23 + 0x109];
          uStack_2414 = temp[lVar23 + 0x10a];
          uStack_2412 = temp[lVar23 + 0x10b];
          uStack_2410 = temp[lVar23 + 0x10c];
          uStack_240e = temp[lVar23 + 0x10d];
          uStack_240c = temp[lVar23 + 0x10e];
          uStack_240a = temp[lVar23 + 0x10f];
          lVar23 = uVar29 + lVar30;
          uStack_2417 = temp[lVar23 + 0x148];
          uStack_2415 = temp[lVar23 + 0x149];
          uStack_2413 = temp[lVar23 + 0x14a];
          uStack_2411 = temp[lVar23 + 0x14b];
          uStack_240f = temp[lVar23 + 0x14c];
          uStack_240d = temp[lVar23 + 0x14d];
          uStack_240b = temp[lVar23 + 0x14e];
          uStack_2409 = temp[lVar23 + 0x14f];
          lVar23 = uVar29 + lVar30;
          local_2408 = temp[lVar23 + 0x188];
          uStack_2406 = temp[lVar23 + 0x189];
          uStack_2404 = temp[lVar23 + 0x18a];
          uStack_2402 = temp[lVar23 + 0x18b];
          uStack_2400 = temp[lVar23 + 0x18c];
          uStack_23fe = temp[lVar23 + 0x18d];
          uStack_23fc = temp[lVar23 + 0x18e];
          uStack_23fa = temp[lVar23 + 399];
          lVar23 = uVar29 + lVar30;
          uStack_2407 = temp[lVar23 + 0x1c8];
          uStack_2405 = temp[lVar23 + 0x1c9];
          uStack_2403 = temp[lVar23 + 0x1ca];
          uStack_2401 = temp[lVar23 + 0x1cb];
          uStack_23ff = temp[lVar23 + 0x1cc];
          uStack_23fd = temp[lVar23 + 0x1cd];
          uStack_23fb = temp[lVar23 + 0x1ce];
          uStack_23f9 = temp[lVar23 + 0x1cf];
          local_2438._0_4_ = CONCAT13(puVar31[9],CONCAT12(puVar1[9],CONCAT11(puVar31[8],puVar1[8])))
          ;
          local_2438._4_4_ =
               CONCAT13(puVar31[0xb],CONCAT12(puVar1[0xb],CONCAT11(puVar31[10],puVar1[10])));
          convolve8_8_ssse3((__m128i *)temp_1,s);
          convolve8_8_ssse3((__m128i *)&local_2438,s);
          local_2528._0_2_ = (short)extraout_XMM0_Qa;
          local_2528._2_2_ = (short)((ulong)extraout_XMM0_Qa >> 0x10);
          local_2528._4_2_ = (short)((ulong)extraout_XMM0_Qa >> 0x20);
          local_2528._6_2_ = (short)((ulong)extraout_XMM0_Qa >> 0x30);
          sStack_2520 = (short)extraout_XMM0_Qb;
          sStack_251e = (short)((ulong)extraout_XMM0_Qb >> 0x10);
          sStack_251c = (short)((ulong)extraout_XMM0_Qb >> 0x20);
          sStack_251a = (short)((ulong)extraout_XMM0_Qb >> 0x30);
          puVar31 = puVar33 + uVar29;
          *puVar31 = (0 < (short)local_2528) * ((short)local_2528 < 0x100) * (char)extraout_XMM0_Qa
                     - (0xff < (short)local_2528);
          puVar31[1] = (0 < local_2528._2_2_) * (local_2528._2_2_ < 0x100) *
                       (char)((ulong)extraout_XMM0_Qa >> 0x10) - (0xff < local_2528._2_2_);
          puVar31[2] = (0 < local_2528._4_2_) * (local_2528._4_2_ < 0x100) *
                       (char)((ulong)extraout_XMM0_Qa >> 0x20) - (0xff < local_2528._4_2_);
          puVar31[3] = (0 < local_2528._6_2_) * (local_2528._6_2_ < 0x100) *
                       (char)((ulong)extraout_XMM0_Qa >> 0x30) - (0xff < local_2528._6_2_);
          puVar31[4] = (0 < sStack_2520) * (sStack_2520 < 0x100) * (char)extraout_XMM0_Qb -
                       (0xff < sStack_2520);
          puVar31[5] = (0 < sStack_251e) * (sStack_251e < 0x100) *
                       (char)((ulong)extraout_XMM0_Qb >> 0x10) - (0xff < sStack_251e);
          puVar31[6] = (0 < sStack_251c) * (sStack_251c < 0x100) *
                       (char)((ulong)extraout_XMM0_Qb >> 0x20) - (0xff < sStack_251c);
          puVar31[7] = (0 < sStack_251a) * (sStack_251a < 0x100) *
                       (char)((ulong)extraout_XMM0_Qb >> 0x30) - (0xff < sStack_251a);
          puVar31[8] = (0 < extraout_XMM0_Wa_00) * (extraout_XMM0_Wa_00 < 0x100) *
                       (char)extraout_XMM0_Wa_00 - (0xff < extraout_XMM0_Wa_00);
          puVar31[9] = (0 < extraout_XMM0_Wb_00) * (extraout_XMM0_Wb_00 < 0x100) *
                       (char)extraout_XMM0_Wb_00 - (0xff < extraout_XMM0_Wb_00);
          puVar31[10] = (0 < extraout_XMM0_Wc_00) * (extraout_XMM0_Wc_00 < 0x100) *
                        (char)extraout_XMM0_Wc_00 - (0xff < extraout_XMM0_Wc_00);
          puVar31[0xb] = (0 < extraout_XMM0_Wd_00) * (extraout_XMM0_Wd_00 < 0x100) *
                         (char)extraout_XMM0_Wd_00 - (0xff < extraout_XMM0_Wd_00);
          puVar31[0xc] = (0 < extraout_XMM0_We_00) * (extraout_XMM0_We_00 < 0x100) *
                         (char)extraout_XMM0_We_00 - (0xff < extraout_XMM0_We_00);
          puVar31[0xd] = (0 < extraout_XMM0_Wf_00) * (extraout_XMM0_Wf_00 < 0x100) *
                         (char)extraout_XMM0_Wf_00 - (0xff < extraout_XMM0_Wf_00);
          puVar31[0xe] = (0 < extraout_XMM0_Wg_00) * (extraout_XMM0_Wg_00 < 0x100) *
                         (char)extraout_XMM0_Wg_00 - (0xff < extraout_XMM0_Wg_00);
          puVar31[0xf] = (0 < extraout_XMM0_Wh_00) * (extraout_XMM0_Wh_00 < 0x100) *
                         (char)extraout_XMM0_Wh_00 - (0xff < extraout_XMM0_Wh_00);
        }
      }
      local_257c = local_257c + y_step_q4;
      puVar33 = puVar33 + dst_stride;
    }
  }
  return;
}

Assistant:

void aom_scaled_2d_ssse3(const uint8_t *src, ptrdiff_t src_stride, uint8_t *dst,
                         ptrdiff_t dst_stride, const InterpKernel *filter,
                         int x0_q4, int x_step_q4, int y0_q4, int y_step_q4,
                         int w, int h) {
  // Note: Fixed size intermediate buffer, temp, places limits on parameters.
  // 2d filtering proceeds in 2 steps:
  //   (1) Interpolate horizontally into an intermediate buffer, temp.
  //   (2) Interpolate temp vertically to derive the sub-pixel result.
  // Deriving the maximum number of rows in the temp buffer (135):
  // --Smallest scaling factor is x1/2 ==> y_step_q4 = 32 (Normative).
  // --Largest block size is 64x64 pixels.
  // --64 rows in the downscaled frame span a distance of (64 - 1) * 32 in the
  //   original frame (in 1/16th pixel units).
  // --Must round-up because block may be located at sub-pixel position.
  // --Require an additional SUBPEL_TAPS rows for the 8-tap filter tails.
  // --((64 - 1) * 32 + 15) >> 4 + 8 = 135.
  // --Require an additional 8 rows for the horiz_w8 transpose tail.
  // When calling in frame scaling function, the smallest scaling factor is x1/4
  // ==> y_step_q4 = 64. Since w and h are at most 16, the temp buffer is still
  // big enough.
  DECLARE_ALIGNED(16, uint8_t, temp[(135 + 8) * 64]);
  const int intermediate_height =
      (((h - 1) * y_step_q4 + y0_q4) >> SUBPEL_BITS) + SUBPEL_TAPS;

  assert(w <= 64);
  assert(h <= 64);
  assert(y_step_q4 <= 32 || (y_step_q4 <= 64 && h <= 32));
  assert(x_step_q4 <= 64);

  if (w >= 8) {
    scaledconvolve_horiz_w8(src - src_stride * (SUBPEL_TAPS / 2 - 1),
                            src_stride, temp, 64, filter, x0_q4, x_step_q4, w,
                            intermediate_height);
  } else {
    scaledconvolve_horiz_w4(src - src_stride * (SUBPEL_TAPS / 2 - 1),
                            src_stride, temp, 64, filter, x0_q4, x_step_q4, w,
                            intermediate_height);
  }

  if (w >= 16) {
    scaledconvolve_vert_w16(temp + 64 * (SUBPEL_TAPS / 2 - 1), 64, dst,
                            dst_stride, filter, y0_q4, y_step_q4, w, h);
  } else if (w == 8) {
    scaledconvolve_vert_w8(temp + 64 * (SUBPEL_TAPS / 2 - 1), 64, dst,
                           dst_stride, filter, y0_q4, y_step_q4, w, h);
  } else {
    scaledconvolve_vert_w4(temp + 64 * (SUBPEL_TAPS / 2 - 1), 64, dst,
                           dst_stride, filter, y0_q4, y_step_q4, w, h);
  }
}